

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlFreeElement(xmlElementPtr elem)

{
  xmlElementPtr elem_local;
  
  if (elem != (xmlElementPtr)0x0) {
    xmlUnlinkNode((xmlNodePtr)elem);
    xmlFreeDocElementContent(elem->doc,elem->content);
    if (elem->name != (xmlChar *)0x0) {
      (*xmlFree)(elem->name);
    }
    if (elem->prefix != (xmlChar *)0x0) {
      (*xmlFree)(elem->prefix);
    }
    if (elem->contModel != (xmlRegexpPtr)0x0) {
      xmlRegFreeRegexp(elem->contModel);
    }
    (*xmlFree)(elem);
  }
  return;
}

Assistant:

static void
xmlFreeElement(xmlElementPtr elem) {
    if (elem == NULL) return;
    xmlUnlinkNode((xmlNodePtr) elem);
    xmlFreeDocElementContent(elem->doc, elem->content);
    if (elem->name != NULL)
	xmlFree((xmlChar *) elem->name);
    if (elem->prefix != NULL)
	xmlFree((xmlChar *) elem->prefix);
#ifdef LIBXML_REGEXP_ENABLED
    if (elem->contModel != NULL)
	xmlRegFreeRegexp(elem->contModel);
#endif
    xmlFree(elem);
}